

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O2

void Rwt_Man5ExploreStart(void)

{
  s_pManRwrExp5_body = (stmm_table *)0x0;
  DAT_00a59c68 = (stmm_table *)0x0;
  s_pManRwrExp5_body = stmm_init_table(st__numcmp,st__numhash);
  DAT_00a59c68 = stmm_init_table(st__numcmp,st__numhash);
  return;
}

Assistant:

void Rwt_Man5ExploreStart()
{
    Rwr_Man5_t * p;
    p = ABC_ALLOC( Rwr_Man5_t, 1 );
    memset( p, 0, sizeof(Rwr_Man5_t) );
    p->tTableNN  = stmm_init_table( st__numcmp, st__numhash );
    p->tTableNPN = stmm_init_table( st__numcmp, st__numhash );
    s_pManRwrExp5 = p;

//Extra_PrintHex( stdout, Extra_TruthCanonNPN( 0x0000FFFF, 5 ), 5 );
//printf( "\n" );
}